

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixPath.cpp
# Opt level: O0

PosixPath * __thiscall PosixPath::GetFolder(PosixPath *__return_storage_ptr__,PosixPath *this)

{
  PosixPath *this_local;
  PosixPath *newPath;
  
  PosixPath(__return_storage_ptr__);
  SetIsAbsolute(__return_storage_ptr__,(bool)(this->mIsAbsolute & 1));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->mPathComponents,&this->mPathComponents);
  PopPathComponent(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

PosixPath PosixPath::GetFolder() const
{
	PosixPath newPath;
    
	// in edge case of "/" , will return the same path. in empty relative, will enter empty relative
	// in all other cases will return a url with one less component from the component list
    
	newPath.SetIsAbsolute(mIsAbsolute);
	newPath.mPathComponents = mPathComponents;
	newPath.PopPathComponent();
	return newPath;
}